

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O3

void __thiscall FilteredLT::DFS(FilteredLT *this,int r)

{
  vector<int,std::allocator<int>> *this_00;
  uint uVar1;
  BoolView *pBVar2;
  iterator __position;
  int iVar3;
  uint *puVar4;
  int iStack_24;
  
  pBVar2 = (this->p->vs).data;
  if ((sat.assigns.data[(uint)pBVar2[(uint)r].v] != '\0') &&
     ((uint)pBVar2[(uint)r].s * -2 + 1 == (int)sat.assigns.data[(uint)pBVar2[(uint)r].v])) {
    this->visited_innodes = this->visited_innodes + 1;
    LengauerTarjan::DFS(&this->super_LengauerTarjan,r);
    return;
  }
  iVar3 = (this->super_LengauerTarjan).count + 1;
  (this->super_LengauerTarjan).count = iVar3;
  (this->super_LengauerTarjan).semi.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[r] = iVar3;
  (this->super_LengauerTarjan).vertex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[(this->super_LengauerTarjan).count] = r;
  (this->super_LengauerTarjan).label.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[r] = r;
  (this->super_LengauerTarjan).ancestor.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[r] = -1;
  puVar4 = (uint *)succs.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[r].
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
  if (puVar4 != (uint *)succs.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[r].
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish) {
    iStack_24 = r;
    do {
      uVar1 = *puVar4;
      if ((this->super_LengauerTarjan).semi.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[(int)uVar1] == -1) {
        (this->super_LengauerTarjan).parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[(int)uVar1] = iStack_24;
        (**(this->super_LengauerTarjan)._vptr_LengauerTarjan)(this,(ulong)uVar1);
      }
      this_00 = (vector<int,std::allocator<int>> *)
                (preds.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (int)uVar1);
      __position._M_current = *(int **)(this_00 + 8);
      if (__position._M_current == *(int **)(this_00 + 0x10)) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (this_00,__position,&iStack_24);
      }
      else {
        *__position._M_current = iStack_24;
        *(int **)(this_00 + 8) = __position._M_current + 1;
      }
      puVar4 = puVar4 + 1;
    } while (puVar4 != (uint *)succs.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iStack_24].
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void FilteredLT::DFS(int r) {
	if (DEBUG) {
		std::cout << "DFS Visiting " << r << " " << p->getNodeVar(r).isFixed()
							<< ((p->getNodeVar(r).isFixed()) ? static_cast<int>(p->getNodeVar(r).isTrue()) : -1)
							<< '\n';
	}
	if (p->getNodeVar(r).isFixed() && p->getNodeVar(r).isTrue()) {
		visited_innodes++;
	}
	LengauerTarjan::DFS(r);
}